

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O1

uint32_t __thiscall Cache::getId(Cache *this,uint32_t addr)

{
  bool bVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  byte bVar5;
  
  uVar2 = (this->policy).blockSize;
  bVar5 = 0xff;
  if (uVar2 != 0) {
    bVar5 = 0;
    if ((uVar2 != 1) && (bVar5 = 0, 1 < uVar2)) {
      bVar5 = 0;
      do {
        bVar5 = bVar5 + 1;
        bVar1 = 3 < uVar2;
        uVar2 = uVar2 >> 1;
      } while (bVar1);
    }
  }
  uVar4 = (ulong)(this->policy).blockNum / (ulong)(this->policy).associativity;
  uVar2 = (uint)uVar4;
  bVar3 = 0xff;
  if (uVar2 != 0) {
    bVar3 = 0;
    if ((uVar2 != 1) && (bVar3 = 0, 1 < uVar2)) {
      bVar3 = 0;
      do {
        bVar3 = bVar3 + 1;
        uVar2 = (uint)uVar4;
        uVar4 = uVar4 >> 1;
      } while (3 < uVar2);
    }
  }
  return addr >> (bVar5 & 0x1f) & ~(-1 << (bVar3 & 0x1f));
}

Assistant:

uint32_t Cache::getId(uint32_t addr) {
  uint32_t offsetBits = log2i(policy.blockSize);
  uint32_t idBits = log2i(policy.blockNum / policy.associativity);
  uint32_t mask = (1 << idBits) - 1;
  return (addr >> offsetBits) & mask;
}